

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexSubImage2DBufferCase::createTexture(TexSubImage2DBufferCase *this)

{
  int iVar1;
  int iVar2;
  int height_00;
  deUint32 format;
  deUint32 type;
  deInt32 dVar3;
  reference pvVar4;
  size_type sVar5;
  int local_184;
  PixelBufferAccess local_138;
  Vector<float,_4> local_10c;
  Vector<float,_4> local_fc;
  undefined1 local_ec [8];
  Vec4 colorB;
  Vector<float,_4> local_cc;
  undefined1 local_bc [8];
  Vec4 colorA;
  Vec4 cBias;
  Vec4 cScale;
  int height;
  int rowPitch;
  int rowLength;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 local_28;
  deUint32 buf;
  deUint32 tex;
  int pixelSize;
  TransferFormat local_18;
  TransferFormat transferFmt;
  TexSubImage2DBufferCase *this_local;
  
  _tex = (this->super_Texture2DSpecCase).m_texFormat;
  transferFmt = (TransferFormat)this;
  local_18 = glu::getTransferFormat(_tex);
  buf = tcu::TextureFormat::getPixelSize(&(this->super_Texture2DSpecCase).m_texFormat);
  local_28 = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,&local_28
            );
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
             local_28);
  dVar3 = deAlign32((this->super_Texture2DSpecCase).m_width * buf,4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
             (long)(dVar3 * (this->super_Texture2DSpecCase).m_height));
  iVar1 = (this->super_Texture2DSpecCase).m_width;
  iVar2 = (this->super_Texture2DSpecCase).m_height;
  dVar3 = deAlign32(iVar1 * buf,4);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&rowPitch,&(this->super_Texture2DSpecCase).m_texFormat,iVar1,iVar2
             ,1,dVar3,0,pvVar4);
  tcu::fillWithComponentGradients
            ((PixelBufferAccess *)&rowPitch,
             &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin,
             &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax);
  iVar1 = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
  iVar2 = (this->super_Texture2DSpecCase).m_width;
  height_00 = (this->super_Texture2DSpecCase).m_height;
  format = local_18.format;
  type = local_18.dataType;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  sglr::ContextWrapper::glTexImage2D
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,0,
             iVar1,iVar2,height_00,0,format,type,pvVar4);
  if (this->m_rowLength < 1) {
    local_184 = this->m_subW;
  }
  else {
    local_184 = this->m_rowLength;
  }
  dVar3 = deAlign32(local_184 * buf,this->m_alignment);
  iVar1 = this->m_subH;
  iVar2 = this->m_skipRows;
  tcu::operator-((tcu *)(cBias.m_data + 2),&(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax
                 ,&(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colorA.m_data + 2),
             &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_cc,(Vector<float,_4> *)(colorB.m_data + 2),
                 (Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_bc,&local_cc,(Vector<float,_4> *)(colorA.m_data + 2));
  tcu::Vector<float,_4>::Vector(&local_10c,0.0,1.0,0.0,1.0);
  tcu::operator*((tcu *)&local_fc,&local_10c,(Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_ec,&local_fc,(Vector<float,_4> *)(colorA.m_data + 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
             (long)(dVar3 * (iVar1 + iVar2) + this->m_offset));
  iVar1 = this->m_subW;
  iVar2 = this->m_subH;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_138,&(this->super_Texture2DSpecCase).m_texFormat,iVar1,iVar2,1,dVar3,0,
             pvVar4 + (long)this->m_offset +
                      (long)(int)(this->m_skipPixels * buf) + (long)(this->m_skipRows * dVar3));
  tcu::fillWithGrid(&local_138,4,(Vec4 *)local_bc,(Vec4 *)local_ec);
  sglr::ContextWrapper::glGenBuffers
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  sglr::ContextWrapper::glBindBuffer
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x88ec,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  sglr::ContextWrapper::glBufferData
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x88ec,
             (long)(int)sVar5,pvVar4,0x88e4);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf2,
             this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf3,
             this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf4,
             this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             this->m_alignment);
  sglr::ContextWrapper::glTexSubImage2D
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,0,
             this->m_subX,this->m_subY,this->m_subW,this->m_subH,local_18.format,local_18.dataType,
             (void *)(long)this->m_offset);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);

		// First fill texture with gradient.
		data.resize(deAlign32(m_width*pixelSize, 4)*m_height);
		tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, 1, deAlign32(m_width*pixelSize, 4), 0, &data[0]), m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
		glTexImage2D(GL_TEXTURE_2D, 0, m_internalFormat, m_width, m_height, 0, transferFmt.format, transferFmt.dataType, &data[0]);

		// Fill data with grid.
		{
			int		rowLength	= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch	= deAlign32(rowLength*pixelSize, m_alignment);
			int		height		= m_subH + m_skipRows;
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(rowPitch*height + m_offset);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, 1, rowPitch, 0, &data[0] + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER,	buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER,	(int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);
		glTexSubImage2D(GL_TEXTURE_2D, 0, m_subX, m_subY, m_subW, m_subH, transferFmt.format, transferFmt.dataType, (const void*)(deUintptr)m_offset);
	}